

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O2

bool __thiscall
leveldb::anon_unknown_0::BloomFilterPolicy::KeyMayMatch
          (BloomFilterPolicy *this,Slice *key,Slice *bloom_filter)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = bloom_filter->size_;
  if (uVar1 < 2) {
    bVar8 = false;
  }
  else {
    pcVar2 = bloom_filter->data_;
    uVar7 = (ulong)pcVar2[uVar1 - 1];
    bVar8 = true;
    if (uVar7 < 0x1f) {
      uVar6 = BloomHash(key);
      uVar4 = uVar6 << 0xf;
      uVar5 = uVar6 >> 0x11;
      while( true ) {
        bVar8 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if ((bVar8) ||
           (auVar3._8_8_ = 0, auVar3._0_8_ = uVar1 * 8 - 8,
           ((byte)pcVar2[SUB168(ZEXT416(uVar6) % auVar3,0) >> 3 & 0x1fffffff] >>
            (SUB164(ZEXT416(uVar6) % auVar3,0) & 7) & 1) == 0)) break;
        uVar6 = uVar6 + (uVar4 | uVar5);
      }
    }
  }
  return bVar8;
}

Assistant:

size_t size() const { return size_; }